

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

aiVectorKey * Read<aiVectorKey>(aiVectorKey *__return_storage_ptr__,IOStream *stream)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  __return_storage_ptr__->mTime = 0.0;
  (__return_storage_ptr__->mValue).x = 0.0;
  (__return_storage_ptr__->mValue).y = 0.0;
  (__return_storage_ptr__->mValue).z = 0.0;
  dVar1 = Read<double>(stream);
  __return_storage_ptr__->mTime = dVar1;
  fVar2 = Read<float>(stream);
  fVar3 = Read<float>(stream);
  fVar4 = Read<float>(stream);
  (__return_storage_ptr__->mValue).x = fVar2;
  (__return_storage_ptr__->mValue).y = fVar3;
  (__return_storage_ptr__->mValue).z = fVar4;
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey Read<aiVectorKey>(IOStream * stream) {
    aiVectorKey v;
    v.mTime = Read<double>(stream);
    v.mValue = Read<aiVector3D>(stream);
    return v;
}